

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIStaticText::~CGUIStaticText(CGUIStaticText *this)

{
  ~CGUIStaticText(this,&VTT);
  operator_delete(this,0x198);
  return;
}

Assistant:

CGUIStaticText::~CGUIStaticText()
{
	if (OverrideFont)
		OverrideFont->drop();
}